

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

char * __thiscall CInput::GetClipboardText(CInput *this)

{
  char *str_in;
  
  if (this->m_pClipboardText != (char *)0x0) {
    SDL_free();
  }
  str_in = (char *)SDL_GetClipboardText();
  this->m_pClipboardText = str_in;
  if (str_in != (char *)0x0) {
    str_sanitize_cc(str_in);
  }
  return this->m_pClipboardText;
}

Assistant:

const char *CInput::GetClipboardText()
{
	if(m_pClipboardText)
		SDL_free(m_pClipboardText);
	m_pClipboardText = SDL_GetClipboardText();
	if(m_pClipboardText)
		str_sanitize_cc(m_pClipboardText);
	return m_pClipboardText;
}